

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

void __thiscall crnlib::crn_block_compressor::crn_block_compressor(crn_block_compressor *this)

{
  set_block_pixels_context *unaff_retaddr;
  dxt_image *in_stack_fffffffffffffff0;
  
  dxt_image::dxt_image(in_stack_fffffffffffffff0);
  crn_comp_params::crn_comp_params((crn_comp_params *)0x1c4fdd);
  dxt_image::pack_params::pack_params((pack_params *)0x1c4fef);
  dxt_image::set_block_pixels_context::set_block_pixels_context(unaff_retaddr);
  return;
}

Assistant:

crn_block_compressor() {
  }